

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O3

void __thiscall CaDiCaL::Internal::vmessage(Internal *this,char *fmt,va_list *ap)

{
  if ((this->opts).quiet != 0) {
    return;
  }
  fputs((this->prefix)._M_dataplus._M_p,_stdout);
  vprintf(fmt,ap);
  fputc(10,_stdout);
  fflush(_stdout);
  return;
}

Assistant:

void Internal::vmessage (const char *fmt, va_list &ap) {
#ifdef LOGGING
  if (!opts.log)
#endif
    if (opts.quiet)
      return;
  print_prefix ();
  vprintf (fmt, ap);
  fputc ('\n', stdout);
  fflush (stdout);
}